

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall i2p::sam::Session::Hello(Session *this)

{
  long lVar1;
  bool bVar2;
  Proxy *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  tuple<Sock_*,_std::default_delete<Sock>_> in_RDI;
  long in_FS_OFFSET;
  unique_ptr<Sock,_std::default_delete<Sock>_> *sock;
  Reply *in_stack_fffffffffffffeb8;
  unique_ptr<Sock,_std::default_delete<Sock>_> *in_stack_fffffffffffffec8;
  _Head_base<0UL,_Sock_*,_false> fmt;
  allocator<char> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_e1 [41];
  Proxy *in_stack_ffffffffffffff48;
  string local_28 [7];
  undefined1 in_stack_ffffffffffffffdf;
  string *in_stack_ffffffffffffffe0;
  Sock *in_stack_ffffffffffffffe8;
  Session *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  fmt._M_head_impl =
       (Sock *)in_RDI.super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
               super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  this_01 = in_RSI;
  Proxy::Connect(in_stack_ffffffffffffff48);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffeb8);
  if (bVar2) {
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*(in_stack_fffffffffffffec8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)CONCAT17(uVar3,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
    SendRequestAndGetReply
              (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
               (bool)in_stack_ffffffffffffffdf);
    Reply::~Reply(in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(&in_stack_fffffffffffffeb8->full);
    std::allocator<char>::~allocator(local_e1);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
             in_RDI.super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
             super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
    }
  }
  else {
    this_00 = (Proxy *)__cxa_allocate_exception(0x10);
    Proxy::ToString_abi_cxx11_(this_00);
    tinyformat::format<std::__cxx11::string>((char *)fmt._M_head_impl,in_RSI);
    std::runtime_error::runtime_error((runtime_error *)this_00,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Session::Hello() const
{
    auto sock = m_control_host.Connect();

    if (!sock) {
        throw std::runtime_error(strprintf("Cannot connect to %s", m_control_host.ToString()));
    }

    SendRequestAndGetReply(*sock, "HELLO VERSION MIN=3.1 MAX=3.1");

    return sock;
}